

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void av1_fwd_txfm2d_32x32_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  transform_1d_avx2_conflict2 p_Var1;
  transform_1d_avx2_conflict2 p_Var2;
  int iVar3;
  int iVar4;
  int size;
  int bit;
  byte in_CL;
  int i_1;
  int i;
  int width_div8;
  int width_div16;
  int c;
  int r;
  transform_1d_avx2_conflict2 row_txfm;
  transform_1d_avx2_conflict2 col_txfm;
  int height;
  int width;
  int cos_bit_row;
  int cos_bit_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  int tx_size;
  __m256i buf1 [128];
  __m256i buf0 [128];
  int in_stack_ffffffffffffdf40;
  int in_stack_ffffffffffffdf44;
  int in_stack_ffffffffffffdf48;
  undefined4 in_stack_ffffffffffffdf4c;
  int iVar5;
  int iVar6;
  int local_20a0;
  int local_209c;
  int stride_00;
  longlong local_2060 [28];
  int in_stack_ffffffffffffe080;
  int in_stack_ffffffffffffe084;
  __m256i *in_stack_ffffffffffffe088;
  __m256i *in_stack_ffffffffffffe090;
  int in_stack_ffffffffffffe768;
  int in_stack_ffffffffffffe76c;
  int in_stack_ffffffffffffe770;
  int in_stack_ffffffffffffe774;
  __m256i *in_stack_ffffffffffffe778;
  int16_t *in_stack_ffffffffffffe780;
  longlong local_1060 [515];
  byte local_45;
  
  local_45 = in_CL;
  iVar3 = get_txw_idx('\x03');
  iVar4 = get_txh_idx('\x03');
  size = (int)av1_fwd_cos_bit_col[iVar3][iVar4];
  bit = (int)av1_fwd_cos_bit_row[iVar3][iVar4];
  stride_00 = 0x20;
  p_Var1 = col_txfm8x32_arr[local_45];
  p_Var2 = row_txfm8x32_arr[local_45];
  for (iVar6 = 0; iVar6 < 2; iVar6 = iVar6 + 1) {
    in_stack_ffffffffffffdf40 = 0;
    load_buffer_16xn_avx2
              (in_stack_ffffffffffffe780,in_stack_ffffffffffffe778,in_stack_ffffffffffffe774,
               in_stack_ffffffffffffe770,in_stack_ffffffffffffe76c,in_stack_ffffffffffffe768,
               in_stack_ffffffffffffdf48);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar3,iVar4),size,bit,stride_00);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar3,iVar4),size,bit,stride_00);
    (*p_Var1)((__m256i *)(local_1060 + (long)(iVar6 << 1) * 4),
              (__m256i *)(local_1060 + (long)(iVar6 << 1) * 4),(int8_t)size,4,4);
    (*p_Var1)((__m256i *)(local_1060 + (long)(iVar6 * 2 + 1) * 4),
              (__m256i *)(local_1060 + (long)(iVar6 * 2 + 1) * 4),(int8_t)size,4,4);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar3,iVar4),size,bit,stride_00);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar3,iVar4),size,bit,stride_00);
  }
  for (local_209c = 0; local_209c < 0x20; local_209c = local_209c + 8) {
    for (local_20a0 = 0; local_20a0 < 4; local_20a0 = local_20a0 + 1) {
      fwd_txfm_transpose_8x8_avx2
                (in_stack_ffffffffffffe090,in_stack_ffffffffffffe088,in_stack_ffffffffffffe084,
                 in_stack_ffffffffffffe080);
    }
  }
  for (iVar5 = 0; iVar5 < 2; iVar5 = iVar5 + 1) {
    (*p_Var2)((__m256i *)(local_2060 + (long)(iVar5 << 1) * 4),
              (__m256i *)(local_2060 + (long)(iVar5 << 1) * 4),(int8_t)bit,4,4);
    (*p_Var2)((__m256i *)(local_2060 + (long)(iVar5 * 2 + 1) * 4),
              (__m256i *)(local_2060 + (long)(iVar5 * 2 + 1) * 4),(int8_t)bit,4,4);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar3,iVar4),size,bit,stride_00);
    round_shift_32_8xn_avx2((__m256i *)CONCAT44(iVar3,iVar4),size,bit,stride_00);
  }
  store_buffer_avx2((__m256i *)CONCAT44(iVar6,iVar5),
                    (int32_t *)CONCAT44(in_stack_ffffffffffffdf4c,in_stack_ffffffffffffdf48),
                    in_stack_ffffffffffffdf44,in_stack_ffffffffffffdf40);
  return;
}

Assistant:

void av1_fwd_txfm2d_32x32_avx2(const int16_t *input, int32_t *output,
                               int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m256i buf0[128], buf1[128];
  const int tx_size = TX_32X32;
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = col_txfm8x32_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm8x32_arr[tx_type];
  int r, c;
  const int width_div16 = (width >> 4);
  const int width_div8 = (width >> 3);

  for (int i = 0; i < width_div16; i++) {
    load_buffer_16xn_avx2(input + (i << 4), &buf0[(i << 1)], stride, height,
                          width_div8, 0, 0);
    round_shift_32_8xn_avx2(&buf0[(i << 1)], height, shift[0], width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], height, shift[0], width_div8);
    col_txfm(&buf0[(i << 1)], &buf0[(i << 1)], cos_bit_col, width_div8,
             width_div8);
    col_txfm(&buf0[(i << 1) + 1], &buf0[(i << 1) + 1], cos_bit_col, width_div8,
             width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1)], height, shift[1], width_div8);
    round_shift_32_8xn_avx2(&buf0[(i << 1) + 1], height, shift[1], width_div8);
  }

  for (r = 0; r < height; r += 8) {
    for (c = 0; c < width_div8; c++) {
      fwd_txfm_transpose_8x8_avx2(&buf0[r * width_div8 + c],
                                  &buf1[c * 8 * width_div8 + (r >> 3)],
                                  width_div8, width_div8);
    }
  }

  for (int i = 0; i < width_div16; i++) {
    row_txfm(&buf1[(i << 1)], &buf1[(i << 1)], cos_bit_row, width_div8,
             width_div8);
    row_txfm(&buf1[(i << 1) + 1], &buf1[(i << 1) + 1], cos_bit_row, width_div8,
             width_div8);
    round_shift_32_8xn_avx2(&buf1[(i << 1)], height, shift[2], width_div8);
    round_shift_32_8xn_avx2(&buf1[(i << 1) + 1], height, shift[2], width_div8);
  }

  store_buffer_avx2(buf1, output, 8, 128);
}